

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutazioneI.cpp
# Opt level: O2

unsigned_short __thiscall PermutazioneI::lisLength(PermutazioneI *this,PermutazioneI *p)

{
  unsigned_short *l;
  unsigned_short *q;
  ulong uVar1;
  unsigned_short llis;
  int imax;
  unsigned_short local_2e;
  int local_2c;
  
  uVar1 = (ulong)((uint)(p->super_Permutazione).dimensione * 2);
  l = (unsigned_short *)operator_new__(uVar1);
  q = (unsigned_short *)operator_new__(uVar1);
  createLengthsArray(this,p,l,q,&local_2e,&local_2c);
  operator_delete__(l);
  operator_delete__(q);
  return local_2e;
}

Assistant:

unsigned short PermutazioneI::lisLength(PermutazioneI* p) {
	unsigned short llis;
	int  imax;

	unsigned short* l = new unsigned short[p->dimensione];
	unsigned short* q = new unsigned short[p->dimensione];

	createLengthsArray(p, l, q, llis, imax);

	delete[] l;
	delete[] q;
	return llis;
}